

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O0

void test_archive_strncpy(void)

{
  archive_string *paVar1;
  undefined1 local_20 [8];
  archive_string s;
  
  local_20 = (undefined1  [8])0x0;
  s.s = (char *)0x0;
  s.length = 0;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x98',0,"0",0,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x98',0,"0",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x98',(char *)0x0,"((void*)0)",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  s.s = (char *)0x0;
  paVar1 = archive_strncat((archive_string *)local_20,"fubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x9b',(uint)((archive_string *)local_20 == paVar1),
                   "&s == archive_strncpy(&s, \"fubar\", 5)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x9c',5,"5",(longlong)s.s,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\x9c',0x20,"32",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\x9c',"fubar","\"fubar\"",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  s.s = (char *)0x0;
  paVar1 = archive_strncat((archive_string *)local_20,"snafubar",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'\x9f',(uint)((archive_string *)local_20 == paVar1),
                   "&s == archive_strncpy(&s, \"snafubar\", 5)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\xa0',5,"5",(longlong)s.s,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'\xa0',0x20,"32",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'\xa0',"snafu","\"snafu\"",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  s.s = (char *)0x0;
  paVar1 = archive_strncat((archive_string *)local_20,"snafu",8);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'£',(uint)((archive_string *)local_20 == paVar1),
                   "&s == archive_strncpy(&s, \"snafu\", 8)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¤',5,"5",(longlong)s.s,"(s).length",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'¤',0x20,"32",s.length,"(s).buffer_length",(void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string.c"
             ,L'¤',"snafu","\"snafu\"",(char *)local_20,"(s).s",(void *)0x0,L'\0');
  archive_string_free((archive_string *)local_20);
  return;
}

Assistant:

static void
test_archive_strncpy(void)
{
	struct archive_string s;

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);

	/* perfect length */
	assert(&s == archive_strncpy(&s, "fubar", 5));
	assertExactString(5, EXTENT, "fubar", s);

	/* short read */
	assert(&s == archive_strncpy(&s, "snafubar", 5));
	assertExactString(5, EXTENT, "snafu", s);

	/* long read is ok too! */
	assert(&s == archive_strncpy(&s, "snafu", 8));
	assertExactString(5, EXTENT, "snafu", s);

	archive_string_free(&s);
}